

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O0

void __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVector>::Expand
          (BGIP_SolverBranchAndBound<JointPolicyPureVector> *this,BGIP_BnB_NodePtr *node,Index JA)

{
  reference this_00;
  BGIP_BnB_Node *this_01;
  type pBVar1;
  type pBVar2;
  type this_02;
  size_t sVar3;
  reference pvVar4;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  ostream *poVar8;
  uint in_EDX;
  shared_ptr<BGIP_BnB_Node> *in_RSI;
  BayesianGameBase *in_RDI;
  double dVar9;
  Index agI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indTypes;
  Index jt_bgI;
  Index jt_oI;
  BGIP_BnB_NodePtr nodeExtend;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *ja;
  BGIP_BnB_NodePtr *in_stack_fffffffffffffef8;
  shared_ptr<BGIP_BnB_Node> *in_stack_ffffffffffffff00;
  BGIP_SolverBranchAndBound<JointPolicyPureVector> *in_stack_ffffffffffffff10;
  value_type *in_stack_ffffffffffffff18;
  shared_ptr<BGIP_BnB_Node> *in_stack_ffffffffffffff20;
  Index jTypeI;
  string local_88 [32];
  shared_ptr<BGIP_BnB_Node> local_68;
  uint local_54;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_50;
  value_type local_44;
  undefined4 local_40;
  BGIP_BnB_NodePtr *in_stack_ffffffffffffffc8;
  BGIP_SolverBranchAndBound<JointPolicyPureVector> *in_stack_ffffffffffffffd0;
  
  this_00 = std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          *)(in_RDI + 0x1f0),(ulong)in_EDX);
  this_01 = (BGIP_BnB_Node *)operator_new(0x40);
  pBVar1 = boost::shared_ptr<BGIP_BnB_Node>::operator*(in_RSI);
  BGIP_BnB_Node::BGIP_BnB_Node(this_01,pBVar1);
  boost::shared_ptr<BGIP_BnB_Node>::shared_ptr<BGIP_BnB_Node>
            (in_stack_ffffffffffffff20,(BGIP_BnB_Node *)in_stack_ffffffffffffff18);
  pBVar2 = boost::shared_ptr<BGIP_BnB_Node>::operator->
                     ((shared_ptr<BGIP_BnB_Node> *)&stack0xffffffffffffffd0);
  this_02 = boost::shared_ptr<BGIP_BnB_Node>::operator->(in_RSI);
  sVar3 = BGIP_BnB_Node::GetDepth(this_02);
  BGIP_BnB_Node::SetDepth(pBVar2,(int)sVar3 + 1);
  jTypeI = (Index)((ulong)pBVar2 >> 0x20);
  boost::shared_ptr<BGIP_BnB_Node>::operator->
            ((shared_ptr<BGIP_BnB_Node> *)&stack0xffffffffffffffd0);
  BGIP_BnB_Node::SetParent((BGIP_BnB_Node *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  *(long *)(in_RDI + 0x1c0) = *(long *)(in_RDI + 0x1c0) + 1;
  pBVar2 = boost::shared_ptr<BGIP_BnB_Node>::operator->(in_RSI);
  sVar3 = BGIP_BnB_Node::GetDepth(pBVar2);
  local_40 = (undefined4)sVar3;
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x170),
                      sVar3 & 0xffffffff);
  local_44 = *pvVar4;
  boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::operator->
            ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)(in_RDI + 0x128));
  local_50 = BayesianGameBase::JointToIndividualTypeIndices(in_RDI,jTypeI);
  local_54 = 0;
  while( true ) {
    uVar5 = (ulong)local_54;
    sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_50);
    if (uVar5 == sVar6) break;
    boost::shared_ptr<BGIP_BnB_Node>::operator->
              ((shared_ptr<BGIP_BnB_Node> *)&stack0xffffffffffffffd0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,(ulong)local_54);
    BGIP_BnB_Node::SetAction
              ((BGIP_BnB_Node *)in_stack_ffffffffffffff00,
               (Index)((ulong)in_stack_fffffffffffffef8 >> 0x20),(Index)in_stack_fffffffffffffef8);
    local_54 = local_54 + 1;
  }
  if (((byte)in_RDI[0x1a5] & 1) == 0) {
    in_stack_ffffffffffffff18 =
         (value_type *)
         boost::shared_ptr<BGIP_BnB_Node>::operator->
                   ((shared_ptr<BGIP_BnB_Node> *)&stack0xffffffffffffffd0);
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x150),(ulong)local_44)
    ;
    BGIP_BnB_Node::UpdateH(-*pvVar7);
  }
  else {
    in_stack_ffffffffffffff20 = &local_68;
    boost::shared_ptr<BGIP_BnB_Node>::shared_ptr
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    ReComputeH(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    boost::shared_ptr<BGIP_BnB_Node>::~shared_ptr((shared_ptr<BGIP_BnB_Node> *)0x13d0d7);
  }
  pBVar2 = boost::shared_ptr<BGIP_BnB_Node>::operator->
                     ((shared_ptr<BGIP_BnB_Node> *)&stack0xffffffffffffffd0);
  dVar9 = GetContribution(in_stack_ffffffffffffff10,(Index)((ulong)pBVar2 >> 0x20),(Index)pBVar2);
  BGIP_BnB_Node::UpdateG(dVar9);
  if (4 < *(int *)(in_RDI + 0x110)) {
    poVar8 = std::operator<<((ostream *)&std::cout,"BGIP_SolverBranchAndBound Adding node: ");
    boost::shared_ptr<BGIP_BnB_Node>::operator->
              ((shared_ptr<BGIP_BnB_Node> *)&stack0xffffffffffffffd0);
    BGIP_BnB_Node::SoftPrint_abi_cxx11_();
    poVar8 = std::operator<<(poVar8,local_88);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_88);
  }
  pBVar2 = boost::shared_ptr<BGIP_BnB_Node>::operator->(in_RSI);
  dVar9 = BGIP_BnB_Node::GetF(pBVar2);
  if (*(double *)(in_RDI + 0x1a8) <= dVar9) {
    std::
    priority_queue<boost::shared_ptr<BGIP_BnB_Node>,_std::vector<boost::shared_ptr<BGIP_BnB_Node>,_std::allocator<boost::shared_ptr<BGIP_BnB_Node>_>_>,_std::less<boost::shared_ptr<BGIP_BnB_Node>_>_>
    ::push((priority_queue<boost::shared_ptr<BGIP_BnB_Node>,_std::vector<boost::shared_ptr<BGIP_BnB_Node>,_std::allocator<boost::shared_ptr<BGIP_BnB_Node>_>_>,_std::less<boost::shared_ptr<BGIP_BnB_Node>_>_>
            *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  else {
    *(long *)(in_RDI + 0x1c8) = *(long *)(in_RDI + 0x1c8) + 1;
  }
  boost::shared_ptr<BGIP_BnB_Node>::~shared_ptr((shared_ptr<BGIP_BnB_Node> *)0x13d2a1);
  return;
}

Assistant:

void Expand(BGIP_BnB_NodePtr node, Index JA)
    {
        const std::vector<Index> &ja=_m_jaToIndCache[JA];
        
        // Create a new node, copy from its parent
        BGIP_BnB_NodePtr nodeExtend=BGIP_BnB_NodePtr(new BGIP_BnB_Node(*node));

        nodeExtend->SetDepth( node->GetDepth() + 1 );
#if INCR_EXPAND
        nodeExtend->ClearAlreadyExpanded();
#endif
        nodeExtend->SetParent(node);
        _m_nrNodesExpanded++;
        
        //jt_oI of *nodeExtended* is *node*->GetDepth
        Index jt_oI = node->GetDepth();
        Index jt_bgI = _m_jtIndexMapping[jt_oI];
        
        // update the new nodes joint policy
        const std::vector<Index> &indTypes=
            _m_bgip->JointToIndividualTypeIndices(jt_bgI);
        for(Index agI=0;agI!=indTypes.size();++agI)
        {
#if MAINTAIN_FULL_POL        
            nodeExtend->SetAction(agI,indTypes[agI],ja[agI]);
#else
            nodeExtend->SetAction(agI,ja[agI]);
#endif

#if CACHE_IMPLIED_JPOL
            //update the implied policy:
            //(this is used by ReComputeH below!)
            _m_impliedJPol[agI][ indTypes[agI] ] = ja[agI];
#endif
        }
        
        // update the G and H values, which automatically updates F:
        if(_m_reComputeH)
            ReComputeH(nodeExtend);
        else
        {
            // first we substract the heuristic CI value for the
            // current joint type
            nodeExtend->UpdateH(-_m_completeInformationValues[jt_bgI]);
        }
        // then we add the real value to G
        nodeExtend->UpdateG(GetContribution(jt_bgI,JA));
                
        if(_m_verbosity>4)
            std::cout << "BGIP_SolverBranchAndBound Adding node: "
                      << nodeExtend->SoftPrint() << std::endl;
        
#if INCR_EXPAND
        // keep track of already expanded nodes
        node->SetAlreadyExpanded(JA);
#endif

        if(node->GetF() < _m_CBGlowerBound)
            _m_nrNodesPruned++; // do nothing, by not putting it on the
                                // queue it will be deleted
        else
            // add the node to the queue
            _m_openQueue->push(nodeExtend);
    }